

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

VisitReturn __thiscall
QMakeEvaluator::visitProLoop(QMakeEvaluator *this,ProKey *_variable,ushort *exprPtr,ushort *tokPtr)

{
  undefined1 *puVar1;
  Data *pDVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  bool bVar5;
  VisitReturn VVar6;
  CutResult CVar7;
  VisitReturn VVar8;
  uint uVar9;
  int iVar10;
  ProKey *pPVar11;
  ProStringList *pPVar12;
  QArrayDataPointer<ProString> *this_00;
  ProString *pPVar13;
  long lVar14;
  int iVar15;
  QArrayData *pQVar16;
  QArrayData *pQVar17;
  int i;
  int iVar18;
  undefined8 *puVar19;
  ulong uVar20;
  int iVar21;
  storage_type_conflict *psVar22;
  long in_FS_OFFSET;
  bool bVar23;
  QStringView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  bool ok;
  ProString val;
  ProString it_list;
  ProKey variable;
  QString local_190;
  QArrayDataPointer<ProString> local_178;
  QArrayDataPointer<ProString> local_158;
  undefined1 local_138 [28];
  int iStack_11c;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 local_108 [28];
  int iStack_ec;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  QArrayDataPointer<ProString> local_d8;
  QArrayDataPointer<ProString> local_b8;
  undefined1 local_98 [28];
  int iStack_7c;
  undefined1 *local_78;
  undefined1 *puStack_70;
  ushort *local_60;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = exprPtr;
  ProString::ProString((ProString *)local_98);
  local_b8.size = 0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (ProString *)0x0;
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  VVar6 = expandVariableReferences(this,&local_60,0,(ProStringList *)&local_d8,true);
  VVar8 = ReturnError;
  if (VVar6 == ReturnError) goto LAB_00280ca1;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_108._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff10 = &DAT_aaaaaaaaaaaaaaaa;
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProString::ProString((ProString *)local_108,local_d8.ptr);
  if ((_variable->super_ProString).m_length == 0) {
    bVar5 = ProString::operator==
                      ((ProString *)local_108,(QString *)(QMakeInternal::statics + 0x108));
    if (!bVar5) {
      QVar26.m_data = (storage_type *)0x18;
      QVar26.m_size = (qsizetype)local_138;
      QString::fromLatin1(QVar26);
      message(this,0x310,(QString *)local_138);
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
        }
      }
      VVar8 = ReturnFalse;
      goto LAB_00280c78;
    }
    ProString::ProString((ProString *)local_138,(QString *)(QMakeInternal::statics + 0x120));
    QString::operator=((QString *)local_108,(QString *)local_138);
    stack0xffffffffffffff10 = stack0xfffffffffffffee0;
    local_e8 = local_118;
    puStack_e0 = puStack_110;
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
      }
    }
  }
  else {
    pPVar11 = map(this,_variable);
    QString::operator=((QString *)local_98,(QString *)pPVar11);
    unique0x10000c4a = *(undefined1 **)&(pPVar11->super_ProString).m_offset;
    local_78 = *(undefined1 **)&(pPVar11->super_ProString).m_file;
    puStack_70 = (undefined1 *)(pPVar11->super_ProString).m_hash;
    values((ProStringList *)&local_58,this,(ProKey *)local_98);
    qVar3 = local_58.size;
    pPVar13 = local_58.ptr;
    pDVar2 = local_58.d;
    local_138._16_8_ = local_b8.size;
    local_138._0_8_ = local_b8.d;
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (ProString *)0x0;
    local_138._8_4_ = local_b8.ptr._0_4_;
    local_138._12_4_ = local_b8.ptr._4_4_;
    local_b8.d = pDVar2;
    local_b8.ptr = pPVar13;
    local_b8.size = qVar3;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_138);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_158.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
  values((ProStringList *)&local_158,this,(ProKey *)local_108);
  if ((undefined1 *)local_158.size == (undefined1 *)0x0) {
    bVar5 = ProString::operator==
                      ((ProString *)local_108,(QString *)(QMakeInternal::statics + 0x120));
    uVar4 = local_108._8_8_;
    if (bVar5) {
      bVar5 = true;
      if (this->m_debugLevel != 0) {
        local_138._0_8_ = SEXT48((int)local_98._24_4_);
        local_58.d = (Data *)(long)iStack_7c;
        CVar7 = QtPrivate::QContainerImplHelper::mid
                          (local_98._16_8_,(qsizetype *)local_138,(qsizetype *)&local_58);
        pQVar16 = &(local_58.d)->super_QArrayData;
        if (CVar7 == Null) {
          pQVar16 = (QArrayData *)0x0;
        }
        QVar29.m_data = (storage_type_conflict *)pQVar16;
        QVar29.m_size = (qsizetype)local_138;
        QtPrivate::convertToLocal8Bit(QVar29);
        puVar19 = (undefined8 *)CONCAT44(local_138._12_4_,local_138._8_4_);
        if (puVar19 == (undefined8 *)0x0) {
          puVar19 = &QByteArray::_empty;
        }
        traceMsgInternal(this,"entering infinite loop for %s",puVar19);
        if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138._0_8_,1,0x10);
          }
        }
      }
      goto LAB_00280851;
    }
    local_138._0_8_ = SEXT48((int)local_108._24_4_);
    local_58.d = (Data *)(long)iStack_ec;
    CVar7 = QtPrivate::QContainerImplHelper::mid
                      (local_108._16_8_,(qsizetype *)local_138,(qsizetype *)&local_58);
    psVar22 = (storage_type_conflict *)0x0;
    pQVar16 = (QArrayData *)0x0;
    if (CVar7 != Null) {
      psVar22 = (storage_type_conflict *)(uVar4 + local_138._0_8_ * 2);
      pQVar16 = &(local_58.d)->super_QArrayData;
    }
    QVar27.m_data = psVar22;
    QVar27.m_size = (qsizetype)pQVar16;
    QVar31.m_data = (storage_type_conflict *)QMakeInternal::statics._248_8_;
    QVar31.m_size = QMakeInternal::statics._256_8_;
    uVar9 = QtPrivate::findString(QVar27,0,QVar31,CaseSensitive);
    if (uVar9 != 0xffffffff) {
      local_178.d = (Data *)CONCAT71(local_178.d._1_7_,0xaa);
      pQVar17 = (QArrayData *)(long)(int)uVar9;
      if (pQVar16 < (QArrayData *)(long)(int)uVar9) {
        pQVar17 = pQVar16;
      }
      QVar28.m_data = psVar22;
      QVar28.m_size = (qsizetype)pQVar17;
      uVar20 = QString::toIntegral_helper(QVar28,(bool *)&local_178,10);
      iVar18 = (int)uVar20;
      if (((long)iVar18 == uVar20) && (((ulong)local_178.d & 1) != 0)) {
        local_138._0_8_ = (long)(((ulong)uVar9 << 0x20) + 0x200000000) >> 0x20;
        local_58.d = (Data *)0xffffffffffffffff;
        CVar7 = QtPrivate::QContainerImplHelper::mid
                          ((qsizetype)pQVar16,(qsizetype *)local_138,(qsizetype *)&local_58);
        if (CVar7 == Null) {
          pQVar16 = (QArrayData *)0x0;
          psVar22 = (storage_type_conflict *)0x0;
        }
        else {
          psVar22 = psVar22 + local_138._0_8_;
          pQVar16 = &(local_58.d)->super_QArrayData;
        }
        QVar30.m_data = psVar22;
        QVar30.m_size = (qsizetype)pQVar16;
        lVar14 = QString::toIntegral_helper(QVar30,(bool *)&local_178,10);
        iVar21 = (int)lVar14;
        if ((iVar21 == lVar14) && (((ulong)local_178.d & 1) != 0)) {
          iVar10 = iVar21 - iVar18;
          iVar15 = -iVar10;
          if (0 < iVar10) {
            iVar15 = iVar10;
          }
          QList<ProString>::reserve((QList<ProString> *)&local_158,(ulong)(iVar15 + 1));
          if ((long)uVar20 < lVar14) {
            if (iVar21 < iVar18) {
              iVar21 = iVar18;
            }
            do {
              QString::number((int)&local_58,(int)uVar20);
              ProString::ProString((ProString *)local_138,(QString *)&local_58);
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                        ((QMovableArrayOps<ProString> *)&local_158,local_158.size,
                         (ProString *)local_138);
              QList<ProString>::end((QList<ProString> *)&local_158);
              if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
                }
              }
              if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
                }
              }
              uVar9 = (int)uVar20 + 1;
              uVar20 = (ulong)uVar9;
            } while (iVar21 + 1U != uVar9);
          }
          else {
            do {
              iVar18 = (int)uVar20;
              QString::number((int)&local_58,iVar18);
              ProString::ProString((ProString *)local_138,(QString *)&local_58);
              QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                        ((QMovableArrayOps<ProString> *)&local_158,local_158.size,
                         (ProString *)local_138);
              QList<ProString>::end((QList<ProString> *)&local_158);
              if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
                }
              }
              if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
                }
              }
              uVar20 = (ulong)(iVar18 - 1);
            } while (iVar21 < iVar18);
          }
        }
      }
    }
  }
  if (this->m_debugLevel != 0) {
    local_138._0_8_ = SEXT48((int)local_98._24_4_);
    local_58.d = (Data *)(long)iStack_7c;
    CVar7 = QtPrivate::QContainerImplHelper::mid
                      (local_98._16_8_,(qsizetype *)local_138,(qsizetype *)&local_58);
    pQVar16 = &(local_58.d)->super_QArrayData;
    if (CVar7 == Null) {
      pQVar16 = (QArrayData *)0x0;
    }
    QVar24.m_data = (storage_type_conflict *)pQVar16;
    QVar24.m_size = (qsizetype)local_138;
    QtPrivate::convertToLocal8Bit(QVar24);
    puVar19 = (undefined8 *)CONCAT44(local_138._12_4_,local_138._8_4_);
    if (puVar19 == (undefined8 *)0x0) {
      puVar19 = &QByteArray::_empty;
    }
    formatValueList((QString *)&local_178,(ProStringList *)&local_158,false);
    QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)local_178.ptr);
    pPVar13 = local_58.ptr;
    if (local_58.ptr == (ProString *)0x0) {
      pPVar13 = (ProString *)&QByteArray::_empty;
    }
    traceMsgInternal(this,"entering loop for %s over %s",puVar19,pPVar13);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_178.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_178.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,1,0x10);
      }
    }
  }
  bVar5 = false;
LAB_00280851:
  uVar20 = 0;
  VVar8 = ReturnTrue;
LAB_0028086d:
  iVar18 = (int)uVar20;
  if (bVar5) {
    if (iStack_7c != 0) {
      QString::number((int)&local_190,iVar18);
      ProString::ProString((ProString *)local_138,&local_190);
      local_178.size = 0;
      local_178.d = (Data *)0x0;
      local_178.ptr = (ProString *)0x0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_178,0,(ProString *)local_138);
      QList<ProString>::end((QList<ProString> *)&local_178);
      pPVar12 = QMap<ProKey,_ProStringList>::operator[]
                          ((QMap<ProKey,_ProStringList> *)
                           ((this->m_valuemapStack).
                            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                            .
                            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),(ProKey *)local_98);
      qVar3 = local_178.size;
      pPVar13 = local_178.ptr;
      pDVar2 = local_178.d;
      local_178.size = 0;
      local_178.d = (Data *)0x0;
      local_178.ptr = (ProString *)0x0;
      local_58.d = (pPVar12->super_QList<ProString>).d.d;
      local_58.ptr = (pPVar12->super_QList<ProString>).d.ptr;
      (pPVar12->super_QList<ProString>).d.d = pDVar2;
      (pPVar12->super_QList<ProString>).d.ptr = pPVar13;
      local_58.size = (pPVar12->super_QList<ProString>).d.size;
      (pPVar12->super_QList<ProString>).d.size = qVar3;
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_178);
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
        }
      }
      if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (999 < iVar18) {
      QVar25.m_data = (storage_type *)0x2b;
      QVar25.m_size = (qsizetype)local_138;
      QString::fromLatin1(QVar25);
      message(this,0x310,(QString *)local_138);
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
        }
      }
      goto LAB_00280c24;
    }
    uVar20 = (ulong)(iVar18 + 1);
    if (this->m_debugLevel != 0) {
      traceMsgInternal(this,"loop iteration %d",uVar20);
    }
  }
  else {
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_138._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffee0 = &DAT_aaaaaaaaaaaaaaaa;
    local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_138._8_4_ = 0xaaaaaaaa;
    local_138._12_4_ = 0xaaaaaaaa;
    ProString::ProString((ProString *)local_138);
    uVar20 = (ulong)iVar18;
    lVar14 = uVar20 * 0x30;
    do {
      pPVar13 = local_158.ptr;
      if (local_158.size <= (long)uVar20) {
        iVar18 = 0xc;
        goto LAB_00280b5c;
      }
      uVar20 = uVar20 + 1;
      QString::operator=((QString *)local_138,
                         (QString *)((long)&((local_158.ptr)->m_string).d.d + lVar14));
      puStack_110 = *(undefined1 **)((long)&pPVar13->m_hash + lVar14);
      puVar19 = (undefined8 *)((long)&pPVar13->m_offset + lVar14);
      puVar1 = (undefined1 *)*puVar19;
      local_118 = (undefined1 *)puVar19[1];
      lVar14 = lVar14 + 0x30;
      iStack_11c = (int)((ulong)puVar1 >> 0x20);
      bVar23 = iStack_11c == 0;
      unique0x10001c7e = puVar1;
    } while (bVar23);
    if (this->m_debugLevel != 0) {
      formatValue((QString *)&local_178,(ProString *)local_138,true);
      QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)local_178.ptr);
      pPVar13 = local_58.ptr;
      if (local_58.ptr == (ProString *)0x0) {
        pPVar13 = (ProString *)&QByteArray::_empty;
      }
      traceMsgInternal(this,"loop iteration %s",pPVar13);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_178.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_178.d)->super_QArrayData,2,0x10);
        }
      }
    }
    local_178.d = (Data *)0x0;
    local_178.ptr = (ProString *)0x0;
    iVar18 = 0;
    local_178.size = 0;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)&local_178,0,(ProString *)local_138);
    QList<ProString>::end((QList<ProString> *)&local_178);
    pPVar12 = QMap<ProKey,_ProStringList>::operator[]
                        ((QMap<ProKey,_ProStringList> *)
                         ((this->m_valuemapStack).
                          super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          .
                          super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev + 1),(ProKey *)local_98);
    qVar3 = local_178.size;
    pPVar13 = local_178.ptr;
    pDVar2 = local_178.d;
    local_178.size = 0;
    local_178.d = (Data *)0x0;
    local_178.ptr = (ProString *)0x0;
    local_58.d = (pPVar12->super_QList<ProString>).d.d;
    local_58.ptr = (pPVar12->super_QList<ProString>).d.ptr;
    (pPVar12->super_QList<ProString>).d.d = pDVar2;
    (pPVar12->super_QList<ProString>).d.ptr = pPVar13;
    local_58.size = (pPVar12->super_QList<ProString>).d.size;
    (pPVar12->super_QList<ProString>).d.size = qVar3;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_178);
LAB_00280b5c:
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
      }
    }
    if (iVar18 != 0) goto LAB_00280bb6;
  }
  VVar8 = visitProBlock(this,tokPtr);
  if (ReturnTrue < VVar8) {
    if (VVar8 != ReturnNext) {
      if (VVar8 == ReturnBreak) {
        VVar8 = ReturnTrue;
      }
      goto LAB_00280c24;
    }
    VVar8 = ReturnTrue;
  }
  goto LAB_0028086d;
LAB_00280bb6:
  if (iVar18 == 0xc) {
LAB_00280c24:
    if (this->m_debugLevel != 0) {
      traceMsgInternal(this,"done looping");
    }
    if (iStack_7c != 0) {
      this_00 = (QArrayDataPointer<ProString> *)
                QMap<ProKey,_ProStringList>::operator[]
                          ((QMap<ProKey,_ProStringList> *)
                           ((this->m_valuemapStack).
                            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                            .
                            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                            ._M_impl._M_node.super__List_node_base._M_prev + 1),(ProKey *)local_98);
      QArrayDataPointer<ProString>::operator=(this_00,&local_b8);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_158);
LAB_00280c78:
  if ((QArrayData *)local_108._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
    }
  }
LAB_00280ca1:
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_b8);
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar8;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProLoop(
        const ProKey &_variable, const ushort *exprPtr, const ushort *tokPtr)
{
    VisitReturn ret = ReturnTrue;
    bool infinite = false;
    int index = 0;
    ProKey variable;
    ProStringList oldVarVal;
    ProStringList it_list_out;
    if (expandVariableReferences(exprPtr, 0, &it_list_out, true) == ReturnError)
        return ReturnError;
    ProString it_list = it_list_out.at(0);
    if (_variable.isEmpty()) {
        if (it_list != statics.strever) {
            evalError(fL1S("Invalid loop expression."));
            return ReturnFalse;
        }
        it_list = ProString(statics.strforever);
    } else {
        variable = map(_variable);
        oldVarVal = values(variable);
    }
    ProStringList list = values(it_list.toKey());
    if (list.isEmpty()) {
        if (it_list == statics.strforever) {
            if (m_cumulative) {
                // The termination conditions wouldn't be evaluated, so we must skip it.
                traceMsg("skipping forever loop in cumulative mode");
                return ReturnFalse;
            }
            infinite = true;
        } else {
            QStringView itl = it_list.toQStringView();
            int dotdot = itl.indexOf(statics.strDotDot);
            if (dotdot != -1) {
                bool ok;
                int start = itl.left(dotdot).toInt(&ok);
                if (ok) {
                    int end = itl.mid(dotdot+2).toInt(&ok);
                    if (ok) {
                        const int absDiff = qAbs(end - start);
                        if (m_cumulative && absDiff > 100) {
                            // Such a loop is unlikely to contribute something useful to the
                            // file collection, and may cause considerable delay.
                            traceMsg("skipping excessive loop in cumulative mode");
                            return ReturnFalse;
                        }
                        list.reserve(absDiff + 1);
                        if (start < end) {
                            for (int i = start; i <= end; i++)
                                list << ProString(QString::number(i));
                        } else {
                            for (int i = start; i >= end; i--)
                                list << ProString(QString::number(i));
                        }
                    }
                }
            }
        }
    }

    if (infinite)
        traceMsg("entering infinite loop for %s", dbgKey(variable));
    else
        traceMsg("entering loop for %s over %s", dbgKey(variable), dbgStrList(list));

    forever {
        if (infinite) {
            if (!variable.isEmpty())
                m_valuemapStack.top()[variable] = ProStringList(ProString(QString::number(index)));
            if (++index > 1000) {
                evalError(fL1S("Ran into infinite loop (> 1000 iterations)."));
                break;
            }
            traceMsg("loop iteration %d", index);
        } else {
            ProString val;
            do {
                if (index >= list.size())
                    goto do_break;
                val = list.at(index++);
            } while (val.isEmpty()); // stupid, but qmake is like that
            traceMsg("loop iteration %s", dbgStr(val));
            m_valuemapStack.top()[variable] = ProStringList(val);
        }

        ret = visitProBlock(tokPtr);
        switch (ret) {
        case ReturnTrue:
        case ReturnFalse:
            break;
        case ReturnNext:
            ret = ReturnTrue;
            break;
        case ReturnBreak:
            ret = ReturnTrue;
            goto do_break;
        default:
            goto do_break;
        }
    }